

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

float * __thiscall Colorf::operator[](Colorf *this,int i)

{
  int i_local;
  Colorf *this_local;
  
  this_local = this;
  if (i != 0) {
    if (i == 1) {
      this_local = (Colorf *)&this->g;
    }
    else {
      this_local = (Colorf *)&this->b;
    }
  }
  return &this_local->r;
}

Assistant:

float& Colorf::operator[](int i){
	switch (i){
		case 0:
			return r;
		case 1:
			return g;
		default:
			return b;
	}
}